

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int walkWindowList(Walker *pWalker,Window *pList,int bOneOnly)

{
  int iVar1;
  Window *pWStack_30;
  int rc;
  Window *pWin;
  int bOneOnly_local;
  Window *pList_local;
  Walker *pWalker_local;
  
  pWStack_30 = pList;
  while( true ) {
    if (pWStack_30 == (Window *)0x0) {
      return 0;
    }
    iVar1 = sqlite3WalkExprList(pWalker,pWStack_30->pOrderBy);
    if (iVar1 != 0) {
      return 2;
    }
    iVar1 = sqlite3WalkExprList(pWalker,pWStack_30->pPartition);
    if (iVar1 != 0) {
      return 2;
    }
    iVar1 = sqlite3WalkExpr(pWalker,pWStack_30->pFilter);
    if (iVar1 != 0) break;
    iVar1 = sqlite3WalkExpr(pWalker,pWStack_30->pStart);
    if (iVar1 != 0) {
      return 2;
    }
    iVar1 = sqlite3WalkExpr(pWalker,pWStack_30->pEnd);
    if (iVar1 != 0) {
      return 2;
    }
    if (bOneOnly != 0) {
      return 0;
    }
    pWStack_30 = pWStack_30->pNextWin;
  }
  return 2;
}

Assistant:

static int walkWindowList(Walker *pWalker, Window *pList, int bOneOnly){
  Window *pWin;
  for(pWin=pList; pWin; pWin=pWin->pNextWin){
    int rc;
    rc = sqlite3WalkExprList(pWalker, pWin->pOrderBy);
    if( rc ) return WRC_Abort;
    rc = sqlite3WalkExprList(pWalker, pWin->pPartition);
    if( rc ) return WRC_Abort;
    rc = sqlite3WalkExpr(pWalker, pWin->pFilter);
    if( rc ) return WRC_Abort;
    rc = sqlite3WalkExpr(pWalker, pWin->pStart);
    if( rc ) return WRC_Abort;
    rc = sqlite3WalkExpr(pWalker, pWin->pEnd);
    if( rc ) return WRC_Abort;
    if( bOneOnly ) break;
  }
  return WRC_Continue;
}